

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall Timer::removeTimedEvent(Timer *this,Event *ev)

{
  iterator node;
  TimerNode timer;
  AutoLock _auto_lock_;
  Node *local_80;
  iterator local_78;
  SmartPtr<Event> local_70;
  IEventDispatcher *local_68;
  TimerListener *pTStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  AutoLock local_48;
  
  local_70.mObj = (Event *)0x0;
  AutoLock::AutoLock(&local_48,&this->mMutex,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                     ,0x186);
  local_80 = ((this->mList).mHead)->next;
  if (local_80 != (this->mList).mTail) {
    do {
      SmartPtr<Event>::operator=(&local_70,(local_80->val).mEvent.mObj);
      local_68 = (local_80->val).mDispatcher;
      pTStack_60 = (local_80->val).mListener;
      local_58._0_4_ = (local_80->val).mPrivateData;
      local_58._4_4_ = (local_80->val).mTick;
      uStack_50._0_4_ = (local_80->val).mRepeatMS;
      uStack_50._4_4_ = (local_80->val).mRemainingMS;
      if (local_70.mObj == ev) {
        JetHead::list<Timer::TimerNode>::iterator::erase(&local_78);
        local_80 = local_78.mNode;
      }
      else if (local_80 != (Node *)0x0) {
        local_80 = local_80->next;
      }
    } while (local_80 != (this->mList).mTail);
  }
  AutoLock::~AutoLock(&local_48);
  SmartPtr<Event>::~SmartPtr(&local_70);
  return;
}

Assistant:

void Timer::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	TimerNode timer;
	
	DebugAutoLock( mMutex );

	JetHead::list<TimerNode>::iterator node = mList.begin();
	while (node != mList.end())
	{
		// Cast the node as a TimerNode
		timer = *node;
		
		// Check if the timer node has an event for the dispatcher
		// specified
		if ( (Event*)timer.mEvent == ev )
		{
			node = node.erase();
			continue;
		}
		++node;
	}	
}